

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.h
# Opt level: O0

PackedColor Imath_3_2::rgb2packed<unsigned_char>(Vec3<unsigned_char> *c)

{
  byte bVar1;
  byte bVar2;
  PackedColor PVar3;
  byte *in_RDI;
  float z;
  float y;
  float x;
  Vec3<float> local_20;
  float local_14;
  float local_10;
  float local_c;
  byte *local_8;
  
  bVar1 = *in_RDI;
  local_8 = in_RDI;
  bVar2 = std::numeric_limits<unsigned_char>::max();
  local_c = (float)bVar1 / (float)bVar2;
  bVar1 = local_8[1];
  bVar2 = std::numeric_limits<unsigned_char>::max();
  local_10 = (float)bVar1 / (float)bVar2;
  bVar1 = local_8[2];
  bVar2 = std::numeric_limits<unsigned_char>::max();
  local_14 = (float)bVar1 / (float)bVar2;
  Vec3<float>::Vec3(&local_20,local_c,local_10,local_14);
  PVar3 = rgb2packed<float>(&local_20);
  return PVar3;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 PackedColor
rgb2packed (const Vec3<T>& c) IMATH_NOEXCEPT
{
    if (std::numeric_limits<T>::is_integer)
    {
        float x = c.x / float (std::numeric_limits<T>::max ());
        float y = c.y / float (std::numeric_limits<T>::max ());
        float z = c.z / float (std::numeric_limits<T>::max ());
        return rgb2packed (V3f (x, y, z));
    }
    else
    {
        // clang-format off
	return (  (PackedColor) (c.x * 255)		|
		(((PackedColor) (c.y * 255)) << 8)	|
		(((PackedColor) (c.z * 255)) << 16)	| 0xFF000000 );
        // clang-format on
    }
}